

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindDegenerates.cpp
# Opt level: O3

void __thiscall
Assimp::FindDegeneratesProcess::Execute(FindDegeneratesProcess *this,aiScene *pScene)

{
  aiMesh *this_00;
  bool bVar1;
  Logger *pLVar2;
  ulong uVar3;
  uint uVar4;
  aiMesh **ppaVar5;
  uint index;
  ulong uVar6;
  
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"FindDegeneratesProcess begin");
  uVar4 = pScene->mNumMeshes;
  if (uVar4 != 0) {
    index = 0;
    do {
      uVar6 = (ulong)index;
      if (pScene->mMeshes[uVar6]->mPrimitiveTypes != 1) {
        bVar1 = ExecuteOnMesh(this,pScene->mMeshes[uVar6]);
        uVar4 = pScene->mNumMeshes;
        if (bVar1) {
          ppaVar5 = pScene->mMeshes;
          this_00 = ppaVar5[uVar6];
          if (index < uVar4 - 1) {
            do {
              pScene->mMeshes[uVar6] = pScene->mMeshes[uVar6 + 1];
              uVar6 = uVar6 + 1;
              uVar3 = (ulong)(pScene->mNumMeshes - 1);
            } while (uVar6 < uVar3);
            ppaVar5 = pScene->mMeshes;
          }
          else {
            uVar3 = (ulong)(uVar4 - 1);
          }
          ppaVar5[uVar3] = (aiMesh *)0x0;
          pScene->mNumMeshes = pScene->mNumMeshes - 1;
          if (this_00 != (aiMesh *)0x0) {
            aiMesh::~aiMesh(this_00);
          }
          operator_delete(this_00,0x520);
          updateSceneGraph(pScene->mRootNode,index);
          index = index - 1;
          uVar4 = pScene->mNumMeshes;
        }
      }
      index = index + 1;
    } while (index < uVar4);
  }
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"FindDegeneratesProcess finished");
  return;
}

Assistant:

void FindDegeneratesProcess::Execute( aiScene* pScene) {
    ASSIMP_LOG_DEBUG("FindDegeneratesProcess begin");
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
    {
        //Do not process point cloud, ExecuteOnMesh works only with faces data
        if ((pScene->mMeshes[i]->mPrimitiveTypes != aiPrimitiveType::aiPrimitiveType_POINT) && ExecuteOnMesh(pScene->mMeshes[i])) {
            removeMesh(pScene, i);
            --i; //the current i is removed, do not skip the next one
        }
    }
    ASSIMP_LOG_DEBUG("FindDegeneratesProcess finished");
}